

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

SRes crnlib::MyRead(void *pp,void *data,size_t *size)

{
  ulong __n;
  
  __n = *size;
  if (*(ulong *)((long)pp + 0x10) < *size) {
    __n = *(ulong *)((long)pp + 0x10);
  }
  memcpy(data,*(void **)((long)pp + 8),__n);
  *(long *)((long)pp + 0x10) = *(long *)((long)pp + 0x10) - __n;
  *(long *)((long)pp + 8) = *(long *)((long)pp + 8) + __n;
  *size = __n;
  return 0;
}

Assistant:

static SRes MyRead(void* pp, void* data, size_t* size) {
  size_t curSize = *size;
  CSeqInStreamBuf* p = (CSeqInStreamBuf*)pp;
  if (p->rem < curSize)
    curSize = p->rem;
  memcpy(data, p->data, curSize);
  p->rem -= curSize;
  p->data += curSize;
  *size = curSize;
  return SZ_OK;
}